

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageDefinition
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *name;
  LocationRecorder location;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined4 uVar2;
  LocationRecorder *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  ErrorLocation in_stack_ffffffffffffff54;
  undefined4 uVar3;
  Message *in_stack_ffffffffffffff58;
  LocationRecorder *this_00;
  string local_90 [16];
  FileDescriptorProto *in_stack_ffffffffffffff80;
  LocationRecorder *in_stack_ffffffffffffff88;
  DescriptorProto *in_stack_ffffffffffffff90;
  Parser *in_stack_ffffffffffffff98;
  Parser *in_stack_ffffffffffffffc0;
  Parser *in_stack_ffffffffffffffc8;
  byte local_1;
  
  bVar1 = Consume(in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0);
  if (bVar1) {
    this_00 = (LocationRecorder *)&stack0xffffffffffffffc0;
    LocationRecorder::LocationRecorder
              ((LocationRecorder *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
    LocationRecorder::RecordLegacyLocation
              (this_00,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    DescriptorProto::mutable_name_abi_cxx11_((DescriptorProto *)0x6096c7);
    bVar1 = ConsumeIdentifier(in_stack_ffffffffffffff98,(string *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
    uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff54);
    if (bVar1) {
      name = DescriptorProto::name_abi_cxx11_((DescriptorProto *)0x60972e);
      bVar1 = anon_unknown_0::IsUpperCamelCase(name);
      uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff44);
      if (!bVar1) {
        DescriptorProto::name_abi_cxx11_((DescriptorProto *)0x609760);
        std::operator+((char *)in_stack_ffffffffffffff88,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffff80);
        std::operator+(name,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff40));
        AddWarning((Parser *)CONCAT44(uVar3,in_stack_ffffffffffffff50),name);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
        std::__cxx11::string::~string(local_90);
      }
      bVar1 = false;
    }
    else {
      local_1 = 0;
      bVar1 = true;
    }
    LocationRecorder::~LocationRecorder
              ((LocationRecorder *)CONCAT44(uVar3,in_stack_ffffffffffffff50));
    if (!bVar1) {
      bVar1 = ParseMessageBlock(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      if (bVar1) {
        local_1 = 1;
      }
      else {
        local_1 = 0;
      }
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Parser::ParseMessageDefinition(
    DescriptorProto* message, const LocationRecorder& message_location,
    const FileDescriptorProto* containing_file) {
  DO(Consume("message"));
  {
    LocationRecorder location(message_location,
                              DescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(message,
                                  DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(message->mutable_name(), "Expected message name."));
    if (!IsUpperCamelCase(message->name())) {
      AddWarning(
          "Message name should be in UpperCamelCase. Found: " +
          message->name() +
          ". See https://developers.google.com/protocol-buffers/docs/style");
    }
  }
  DO(ParseMessageBlock(message, message_location, containing_file));
  return true;
}